

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_type_demo.cpp
# Opt level: O0

void SharedPtrTypeGraphDemo(void)

{
  bool bVar1;
  _List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>
  *e;
  iterator __end1;
  iterator __begin1;
  vector<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>_>
  *__range1;
  vector<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>_>
  all_edges;
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  graph_sharedptr;
  int i;
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  nodes;
  value_type *in_stack_fffffffffffffb18;
  vector<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>_>
  *this;
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  *in_stack_fffffffffffffb20;
  shared_ptr<xmotion::StateExample> *this_00;
  Edge *this_01;
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  *this_02;
  int *in_stack_fffffffffffffb48;
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  *this_03;
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  *this_04;
  double in_stack_fffffffffffffbc8;
  undefined1 *trans;
  shared_ptr<xmotion::StateExample> *in_stack_fffffffffffffbd0;
  shared_ptr<xmotion::StateExample> *dstate;
  shared_ptr<xmotion::StateExample> *in_stack_fffffffffffffbd8;
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  *this_05;
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  *in_stack_fffffffffffffbe0;
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  *this_06;
  __normal_iterator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_*,_std::vector<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>_>_>
  local_308;
  undefined1 *local_300;
  undefined1 local_2f8 [40];
  shared_ptr<xmotion::StateExample> local_2d0;
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  local_2c0 [3];
  shared_ptr<xmotion::StateExample> local_200;
  undefined1 local_1f0 [32];
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  local_1d0 [6];
  int local_1c;
  
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::vector((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
            *)0x1022f4);
  for (local_1c = 0; local_1c < 9; local_1c = local_1c + 1) {
    std::make_shared<xmotion::StateExample,int&>(in_stack_fffffffffffffb48);
    std::
    vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
    ::push_back(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    std::shared_ptr<xmotion::StateExample>::~shared_ptr
              ((shared_ptr<xmotion::StateExample> *)0x102348);
  }
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::Graph((Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
           *)0x1023af);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,0);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,1);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::AddEdge(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
            in_stack_fffffffffffffbc8);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x10243e)
  ;
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x10244b)
  ;
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,0);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,3);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::AddEdge(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
            in_stack_fffffffffffffbc8);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x1024da)
  ;
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x1024e7)
  ;
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,1);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,0);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::AddEdge(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
            in_stack_fffffffffffffbc8);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102576)
  ;
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102583)
  ;
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,1);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,4);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::AddEdge(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
            in_stack_fffffffffffffbc8);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102613)
  ;
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102620)
  ;
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,1);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,2);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::AddEdge(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
            in_stack_fffffffffffffbc8);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x1026b0)
  ;
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x1026bd)
  ;
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,2);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,1);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::AddEdge(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
            in_stack_fffffffffffffbc8);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x10274d)
  ;
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x10275a)
  ;
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,2);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,5);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::AddEdge(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
            in_stack_fffffffffffffbc8);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x1027ea)
  ;
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x1027f7)
  ;
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,3);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,0);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::AddEdge(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
            in_stack_fffffffffffffbc8);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102886)
  ;
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102893)
  ;
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,3);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,4);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::AddEdge(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
            in_stack_fffffffffffffbc8);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102923)
  ;
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102930)
  ;
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,4);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,1);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::AddEdge(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
            in_stack_fffffffffffffbc8);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x1029c0)
  ;
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x1029cd)
  ;
  this_05 = (vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
             *)&stack0xffffffffffffffe8;
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[](this_05,4);
  this_06 = local_1d0;
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[](this_05,3);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::AddEdge(this_06,(shared_ptr<xmotion::StateExample> *)this_05,in_stack_fffffffffffffbd0,
            in_stack_fffffffffffffbc8);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102a5d)
  ;
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102a6a)
  ;
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,4);
  trans = local_1f0;
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,5);
  dstate = &local_200;
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::AddEdge(this_06,(shared_ptr<xmotion::StateExample> *)this_05,dstate,(double)trans);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102afa)
  ;
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102b07)
  ;
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,5);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,2);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::AddEdge(this_06,(shared_ptr<xmotion::StateExample> *)this_05,dstate,(double)trans);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102b97)
  ;
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102ba4)
  ;
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,5);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,4);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::AddEdge(this_06,(shared_ptr<xmotion::StateExample> *)this_05,dstate,(double)trans);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102c2e)
  ;
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102c3b)
  ;
  this_04 = (Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
             *)&stack0xffffffffffffffe8;
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)this_04,5);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)this_04,8);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::AddEdge(this_06,(shared_ptr<xmotion::StateExample> *)this_05,dstate,(double)trans);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102cb9)
  ;
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102cc6)
  ;
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,7);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)&stack0xffffffffffffffe8,4);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::AddEdge(this_06,(shared_ptr<xmotion::StateExample> *)this_05,dstate,(double)trans);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102d44)
  ;
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102d51)
  ;
  this_03 = (vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
             *)&stack0xffffffffffffffe8;
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[](this_03,7);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[](this_03,8);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::AddEdge(this_06,(shared_ptr<xmotion::StateExample> *)this_05,dstate,(double)trans);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102dcf)
  ;
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102ddc)
  ;
  this_01 = (Edge *)&stack0xffffffffffffffe8;
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)this_01,8);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)this_01,5);
  this_02 = local_2c0;
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::AddEdge(this_06,(shared_ptr<xmotion::StateExample> *)this_05,dstate,(double)trans);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102e5a)
  ;
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102e67)
  ;
  this = (vector<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>_>
          *)&stack0xffffffffffffffe8;
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)this,8);
  this_00 = &local_2d0;
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            (this_00,(shared_ptr<xmotion::StateExample> *)this);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::operator[]((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
                *)this,7);
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            (this_00,(shared_ptr<xmotion::StateExample> *)this);
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::AddEdge(this_06,(shared_ptr<xmotion::StateExample> *)this_05,dstate,(double)trans);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102ee3)
  ;
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x102ef0)
  ;
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::GetAllEdges(this_04);
  local_300 = local_2f8;
  local_308._M_current =
       (_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>
        *)std::
          vector<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>_>
          ::begin(this);
  std::
  vector<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>_>
  ::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_*,_std::vector<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>_>_>
                        *)this_00,
                       (__normal_iterator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_*,_std::vector<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>_>_>
                        *)this);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_*,_std::vector<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>_>_>
    ::operator*(&local_308);
    std::
    _List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>
    ::operator->((_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>
                  *)0x102f81);
    xmotion::
    Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
    ::Edge::PrintEdge(this_01);
    __gnu_cxx::
    __normal_iterator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_*,_std::vector<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>_>_>
    ::operator++(&local_308);
  }
  std::
  vector<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>_>
  ::~vector((vector<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>_>
             *)this_01);
  xmotion::
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  ::~Graph(this_02);
  std::
  vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
  ::~vector((vector<std::shared_ptr<xmotion::StateExample>,_std::allocator<std::shared_ptr<xmotion::StateExample>_>_>
             *)this_01);
  return;
}

Assistant:

void SharedPtrTypeGraphDemo() {
  std::vector<std::shared_ptr<StateExample>> nodes;

  // create nodes
  for (int i = 0; i < 9; i++) {
    nodes.push_back(std::make_shared<StateExample>(i));
  }

  // create a graph
  Graph<std::shared_ptr<StateExample>> graph_sharedptr;

  graph_sharedptr.AddEdge(nodes[0], nodes[1], 1.0);
  graph_sharedptr.AddEdge(nodes[0], nodes[3], 1.5);
  graph_sharedptr.AddEdge(nodes[1], nodes[0], 2.0);
  graph_sharedptr.AddEdge(nodes[1], nodes[4], 2.5);
  graph_sharedptr.AddEdge(nodes[1], nodes[2], 1.0);
  graph_sharedptr.AddEdge(nodes[2], nodes[1], 1.5);
  graph_sharedptr.AddEdge(nodes[2], nodes[5], 2.0);
  graph_sharedptr.AddEdge(nodes[3], nodes[0], 2.5);
  graph_sharedptr.AddEdge(nodes[3], nodes[4], 2.5);
  graph_sharedptr.AddEdge(nodes[4], nodes[1], 2.5);
  graph_sharedptr.AddEdge(nodes[4], nodes[3], 2.5);
  graph_sharedptr.AddEdge(nodes[4], nodes[5], 2.5);
  graph_sharedptr.AddEdge(nodes[5], nodes[2], 2.5);
  graph_sharedptr.AddEdge(nodes[5], nodes[4], 2.5);
  graph_sharedptr.AddEdge(nodes[5], nodes[8], 2.5);
  graph_sharedptr.AddEdge(nodes[7], nodes[4], 2.5);
  graph_sharedptr.AddEdge(nodes[7], nodes[8], 2.5);
  graph_sharedptr.AddEdge(nodes[8], nodes[5], 2.5);
  graph_sharedptr.AddEdge(nodes[8], nodes[7], 2.5);

  auto all_edges = graph_sharedptr.GetAllEdges();
  for (auto &e : all_edges) e->PrintEdge();

  // no need to deallocate memory, all data structures are copied to graph
}